

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void btSoftBody::solveClusters(btAlignedObjectArray<btSoftBody_*> *bodies)

{
  int iVar1;
  btSoftBody **ppbVar2;
  int *piVar3;
  btAlignedObjectArray<btSoftBody_*> *in_RDI;
  int j;
  btScalar sor;
  int i;
  int iterations;
  int nb;
  int local_1c;
  int iVar4;
  btScalar sor_00;
  int iVar5;
  
  iVar1 = btAlignedObjectArray<btSoftBody_*>::size(in_RDI);
  iVar5 = 0;
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    ppbVar2 = btAlignedObjectArray<btSoftBody_*>::operator[](in_RDI,iVar4);
    piVar3 = btMax<int>((int *)&stack0xfffffffffffffff0,&((*ppbVar2)->m_cfg).citerations);
    iVar5 = *piVar3;
  }
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    btAlignedObjectArray<btSoftBody_*>::operator[](in_RDI,iVar4);
    prepareClusters((btSoftBody *)CONCAT44(iVar1,iVar5),iVar4);
  }
  for (sor_00 = 0.0; (int)sor_00 < iVar5; sor_00 = (btScalar)((int)sor_00 + 1)) {
    for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
      btAlignedObjectArray<btSoftBody_*>::operator[](in_RDI,local_1c);
      solveClusters((btSoftBody *)CONCAT44(iVar1,iVar5),sor_00);
    }
  }
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    btAlignedObjectArray<btSoftBody_*>::operator[](in_RDI,iVar4);
    cleanupClusters((btSoftBody *)CONCAT44(iVar1,iVar5));
  }
  return;
}

Assistant:

void			btSoftBody::solveClusters(const btAlignedObjectArray<btSoftBody*>& bodies)
{
	const int	nb=bodies.size();
	int			iterations=0;
	int i;

	for(i=0;i<nb;++i)
	{
		iterations=btMax(iterations,bodies[i]->m_cfg.citerations);
	}
	for(i=0;i<nb;++i)
	{
		bodies[i]->prepareClusters(iterations);
	}
	for(i=0;i<iterations;++i)
	{
		const btScalar sor=1;
		for(int j=0;j<nb;++j)
		{
			bodies[j]->solveClusters(sor);
		}
	}
	for(i=0;i<nb;++i)
	{
		bodies[i]->cleanupClusters();
	}
}